

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_compress(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uLong len;
  uLong uStack_28;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  uStack_28 = uncomprLen;
  uncomprLen_local = (uLong)uncompr;
  uncompr_local = (Byte *)comprLen;
  comprLen_local = (uLong)compr;
  sVar3 = strlen(hello);
  uVar1 = compress(comprLen_local,&uncompr_local,hello,sVar3 + 1);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","compress",(ulong)uVar1);
    exit(1);
  }
  strcpy((char *)uncomprLen_local,"garbage");
  uVar1 = uncompress(uncomprLen_local,&stack0xffffffffffffffd8,comprLen_local,uncompr_local);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","uncompress",(ulong)uVar1);
    exit(1);
  }
  iVar2 = strcmp((char *)uncomprLen_local,hello);
  if (iVar2 != 0) {
    fprintf(_stderr,"bad uncompress\n");
    exit(1);
  }
  printf("uncompress(): %s\n",uncomprLen_local);
  return;
}

Assistant:

void test_compress(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    uLong len = (uLong)strlen(hello)+1;

    err = compress(compr, &comprLen, (const Bytef*)hello, len);
    CHECK_ERR(err, "compress");

    strcpy((char*)uncompr, "garbage");

    err = uncompress(uncompr, &uncomprLen, compr, comprLen);
    CHECK_ERR(err, "uncompress");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad uncompress\n");
        exit(1);
    } else {
        printf("uncompress(): %s\n", (char *)uncompr);
    }
}